

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_posix.cpp
# Opt level: O0

bool __thiscall pstore::brokerface::writer::write_impl(writer *this,message_type *msg)

{
  value_type __fd;
  ssize_t sVar1;
  int *piVar2;
  errno_erc local_24;
  int local_20;
  byte local_19;
  int err;
  bool ok;
  message_type *msg_local;
  writer *this_local;
  
  _err = msg;
  msg_local = (message_type *)this;
  __fd = details::descriptor<pstore::details::posix_descriptor_traits>::native_handle(&this->fd_);
  sVar1 = ::write(__fd,_err,0x100);
  local_19 = sVar1 == 0x100;
  if (!(bool)local_19) {
    piVar2 = __errno_location();
    local_20 = *piVar2;
    if (((local_20 != 0xb) && (local_20 != 0xb)) && (local_20 != 0x20)) {
      errno_erc::errno_erc(&local_24,local_20);
      raise<pstore::errno_erc,char[21]>(local_24,(char (*) [21])"write to broker pipe");
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool writer::write_impl (message_type const & msg) {
            bool const ok = ::write (fd_.native_handle (), &msg, sizeof (msg)) == sizeof (msg);
            if (!ok) {
                int const err = errno;
                if (err != EAGAIN && err != EWOULDBLOCK && err != EPIPE) {
                    raise (errno_erc{err}, "write to broker pipe");
                }
            }
            return ok;
        }